

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O1

Uint8 __thiscall SDL2pp::Surface::GetAlphaMod(Surface *this)

{
  int iVar1;
  undefined4 in_register_00000004;
  Exception *this_00;
  Uint8 alpha;
  Uint8 local_11;
  
  local_11 = (Uint8)((uint)in_register_00000004 >> 0x18);
  iVar1 = SDL_GetSurfaceAlphaMod(this->surface_,&local_11);
  if (iVar1 == 0) {
    return local_11;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_GetSurfaceAlphaMod");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Uint8 Surface::GetAlphaMod() const {
	Uint8 alpha;
	if (SDL_GetSurfaceAlphaMod(surface_, &alpha) != 0)
		throw Exception("SDL_GetSurfaceAlphaMod");
	return alpha;
}